

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

void __thiscall QListView::setModelColumn(QListView *this,int column)

{
  QAbstractItemViewPrivate *this_00;
  QAbstractItemModel *pQVar1;
  char cVar2;
  int iVar3;
  long in_FS_OFFSET;
  code *local_60;
  quintptr local_58;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < column) {
    this_00 = *(QAbstractItemViewPrivate **)
               &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget
                .field_0x8;
    pQVar1 = this_00->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_60,&this_00->root);
    iVar3 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1);
    if (column < iVar3) {
      *(int *)&this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
               field_0x50 = column;
      QAbstractItemViewPrivate::doDelayedItemsLayout(this_00,0);
      cVar2 = QAccessible::isActive();
      if (cVar2 != '\0') {
        local_48 = 0xffffffff;
        local_60 = QIcon::QIcon;
        local_40 = 0xffffffff;
        uStack_3c = 0xffffffff;
        uStack_38 = 0xffffffff;
        uStack_34 = 0xffffffff;
        local_58 = 0xaaaaaaaa00000116;
        local_50.ptr = (QAbstractItemModel *)this;
        QAccessible::updateAccessibility((QAccessibleEvent *)&local_60);
        QAccessibleTableModelChangeEvent::~QAccessibleTableModelChangeEvent
                  ((QAccessibleTableModelChangeEvent *)&local_60);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListView::setModelColumn(int column)
{
    Q_D(QListView);
    if (column < 0 || column >= d->model->columnCount(d->root))
        return;
    d->column = column;
    d->doDelayedItemsLayout();
#if QT_CONFIG(accessibility)
    if (QAccessible::isActive()) {
        QAccessibleTableModelChangeEvent event(this, QAccessibleTableModelChangeEvent::ModelReset);
        QAccessible::updateAccessibility(&event);
    }
#endif
}